

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O2

void __thiscall
ot::commissioner::JoinerSession::JoinerSession
          (JoinerSession *this,CommissionerImpl *aCommImpl,ByteArray *aJoinerId,string *aJoinerPSkd,
          uint16_t aJoinerUdpPort,uint16_t aJoinerRouterLocator,Address *aJoinerAddr,
          uint16_t aJoinerPort,Address *aLocalAddr,uint16_t aLocalPort)

{
  undefined4 uVar1;
  undefined1 local_81 [9];
  undefined1 local_78 [40];
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->super_enable_shared_from_this<ot::commissioner::JoinerSession>)._M_weak_this.
  super___weak_ptr<ot::commissioner::JoinerSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<ot::commissioner::JoinerSession>)._M_weak_this.
  super___weak_ptr<ot::commissioner::JoinerSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mCommImpl = aCommImpl;
  local_81._1_8_ = &this->mJoinerId;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_81._1_8_,aJoinerId);
  std::__cxx11::string::string((string *)&this->mJoinerPSKd,(string *)aJoinerPSkd);
  this->mJoinerUdpPort = aJoinerUdpPort;
  this->mJoinerRouterLocator = aJoinerRouterLocator;
  std::
  make_shared<ot::commissioner::JoinerSession::RelaySocket,ot::commissioner::JoinerSession&,ot::commissioner::Address_const&,unsigned_short&,ot::commissioner::Address_const&,unsigned_short&>
            ((JoinerSession *)&this->mRelaySocket,(Address *)this,(unsigned_short *)aJoinerAddr,
             (Address *)&aJoinerPort,(unsigned_short *)aLocalAddr);
  local_78._0_8_ = aCommImpl->mEventBase;
  local_81[0] = (allocator)0x1;
  std::
  make_shared<ot::commissioner::DtlsSession,event_base*,bool,std::shared_ptr<ot::commissioner::JoinerSession::RelaySocket>&>
            ((event_base **)&this->mDtlsSession,(bool *)local_78,
             (shared_ptr<ot::commissioner::JoinerSession::RelaySocket> *)local_81);
  coap::Coap::Coap(&this->mCoap,aCommImpl->mEventBase,
                   &((this->mDtlsSession).
                     super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Endpoint);
  std::__cxx11::string::string((string *)local_78,"/c/jf",(allocator *)local_81);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/joiner_session.cpp:83:39)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/joiner_session.cpp:83:39)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  coap::Resource::Resource(&this->mResourceJoinFin,(string *)local_78,(RequestHandler *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)local_78);
  (this->mExpirationTime).__d.__r = 0;
  coap::Coap::AddResource((Error *)local_78,&this->mCoap,&this->mResourceJoinFin);
  uVar1 = local_78._0_4_;
  std::__cxx11::string::~string((string *)(local_78 + 8));
  if (uVar1 == kNone) {
    return;
  }
  abort();
}

Assistant:

JoinerSession::JoinerSession(CommissionerImpl  &aCommImpl,
                             const ByteArray   &aJoinerId,
                             const std::string &aJoinerPSkd,
                             uint16_t           aJoinerUdpPort,
                             uint16_t           aJoinerRouterLocator,
                             const Address     &aJoinerAddr,
                             uint16_t           aJoinerPort,
                             const Address     &aLocalAddr,
                             uint16_t           aLocalPort)
    : mCommImpl(aCommImpl)
    , mJoinerId(aJoinerId)
    , mJoinerPSKd(aJoinerPSkd)
    , mJoinerUdpPort(aJoinerUdpPort)
    , mJoinerRouterLocator(aJoinerRouterLocator)
    , mRelaySocket(std::make_shared<RelaySocket>(*this, aJoinerAddr, aJoinerPort, aLocalAddr, aLocalPort))
    , mDtlsSession(std::make_shared<DtlsSession>(aCommImpl.GetEventBase(), /* aIsServer */ true, mRelaySocket))
    , mCoap(aCommImpl.GetEventBase(), *mDtlsSession)
    , mResourceJoinFin(uri::kJoinFin, [this](const coap::Request &aRequest) { HandleJoinFin(aRequest); })
{
    SuccessOrDie(mCoap.AddResource(mResourceJoinFin));
}